

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O3

void __thiscall
glcts::ArraysOfArrays::SizedDeclarationsTypenameStyle1<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (SizedDeclarationsTypenameStyle1<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  TestError *this_00;
  long *local_110 [2];
  long local_100 [2];
  SizedDeclarationsTypenameStyle1<glcts::ArraysOfArrays::Interface::GL> *local_f0;
  TestShaderType local_e4;
  undefined8 local_e0;
  long *local_d8 [2];
  long local_c8 [2];
  long *local_b8 [2];
  long local_a8 [2];
  long *local_98 [2];
  long local_88 [2];
  long *local_78 [2];
  long local_68 [2];
  string shader_source;
  
  local_e0 = 1;
  shader_source._M_dataplus._M_p = (pointer)&shader_source.field_2;
  local_f0 = this;
  local_e4 = tested_shader_type;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&shader_source,shader_start_abi_cxx11_,DAT_021ec698 + shader_start_abi_cxx11_
            );
  local_d8[0] = local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"    float","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"[2]","");
  (*(local_f0->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.
    super_TestNode._vptr_TestNode[6])(local_110,local_f0,local_d8,(string *)local_78,local_e0);
  std::__cxx11::string::_M_append((char *)&shader_source,(ulong)local_110[0]);
  if (local_110[0] != local_100) {
    operator_delete(local_110[0],local_100[0] + 1);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if (local_d8[0] != local_c8) {
    operator_delete(local_d8[0],local_c8[0] + 1);
  }
  local_98[0] = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98," x","");
  local_b8[0] = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"[2]","");
  (*(local_f0->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.
    super_TestNode._vptr_TestNode[6])(local_110,local_f0,(string *)local_98,(string *)local_b8,7);
  std::__cxx11::string::_M_append((char *)&shader_source,(ulong)local_110[0]);
  if (local_110[0] != local_100) {
    operator_delete(local_110[0],local_100[0] + 1);
  }
  if (local_b8[0] != local_a8) {
    operator_delete(local_b8[0],local_a8[0] + 1);
  }
  if (local_98[0] != local_88) {
    operator_delete(local_98[0],local_88[0] + 1);
  }
  std::__cxx11::string::append((char *)&shader_source);
  if (local_e4 < SHADER_TYPE_LAST) {
    (*(code *)(&DAT_01ad397c + *(int *)(&DAT_01ad397c + (ulong)tested_shader_type * 4)))();
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Unrecognized shader type.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
             ,0x5d7);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void SizedDeclarationsTypenameStyle1<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	for (size_t max_dimension_index = 1; max_dimension_index <= API::MAX_ARRAY_DIMENSIONS; max_dimension_index++)
	{
		std::string shader_source = shader_start;

		shader_source += this->extend_string("    float", "[2]", max_dimension_index);
		shader_source += this->extend_string(" x", "[2]", API::MAX_ARRAY_DIMENSIONS - max_dimension_index);
		shader_source += ";\n";

		/* End main */
		DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

		/* Execute test */
		EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);
	} /* for (int max_dimension_index = 1; ...) */
}